

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<std::pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution>_>::expand
          (Stack<std::pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution>_> *this)

{
  pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *this_00;
  pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *in_RDI;
  size_t i;
  pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *newStack;
  void *mem;
  size_t newCapacity;
  size_t local_38;
  pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *ppVar1;
  
  if ((in_RDI->first)._capacity == 0) {
    local_38 = 8;
  }
  else {
    local_38 = (in_RDI->first)._capacity << 1;
  }
  this_00 = (pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *)Lib::alloc((size_t)in_RDI);
  if ((in_RDI->first)._capacity != 0) {
    for (ppVar1 = (pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *)0x0;
        ppVar1 < (pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *)
                 (in_RDI->first)._capacity;
        ppVar1 = (pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *)
                 ((long)&(ppVar1->first)._capacity + 1)) {
      std::pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution>::pair(this_00,ppVar1);
      std::pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution>::~pair(in_RDI);
    }
    Lib::free((in_RDI->first)._stack);
  }
  (in_RDI->first)._stack = (Clause **)this_00;
  (in_RDI->first)._cursor = (in_RDI->first)._stack + (in_RDI->first)._capacity * 9;
  (in_RDI->first)._end = (in_RDI->first)._stack + local_38 * 9;
  (in_RDI->first)._capacity = local_38;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }